

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

bool __thiscall
cmFileCommand::HandleDifferentCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pbVar1;
  cmMakefile *this_00;
  char *__s;
  bool bVar2;
  ostream *poVar3;
  char *pcVar4;
  ulong uVar5;
  int iVar6;
  allocator<char> local_1ea;
  allocator<char> local_1e9;
  cmCommand *local_1e8;
  char *local_1e0;
  char *local_1d8;
  char *local_1d0;
  string local_1c8;
  ostringstream e;
  
  iVar6 = 1;
  local_1e0 = (char *)0x0;
  local_1d8 = (char *)0x0;
  local_1d0 = (char *)0x0;
  uVar5 = 1;
  local_1e8 = &this->super_cmCommand;
  do {
    __s = local_1d0;
    pcVar4 = local_1d8;
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <= uVar5) {
      if (local_1d0 == (char *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&e,"DIFFERENT not given result variable name.",
                   (allocator<char> *)&local_1c8);
        cmCommand::SetError(local_1e8,(string *)&e);
      }
      else {
        if ((local_1e0 != (char *)0x0) && (local_1d8 != (char *)0x0)) {
          std::__cxx11::string::string<std::allocator<char>>((string *)&e,local_1e0,&local_1e9);
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,pcVar4,&local_1ea)
          ;
          bVar2 = cmsys::SystemTools::FilesDiffer((string *)&e,&local_1c8);
          std::__cxx11::string::~string((string *)&local_1c8);
          std::__cxx11::string::~string((string *)&e);
          this_00 = local_1e8->Makefile;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&e,__s,(allocator<char> *)&local_1c8);
          pcVar4 = "0";
          if (bVar2) {
            pcVar4 = "1";
          }
          cmMakefile::AddDefinition(this_00,(string *)&e,pcVar4);
          std::__cxx11::string::~string((string *)&e);
          return true;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&e,"DIFFERENT not given FILES option with two file names.",
                   (allocator<char> *)&local_1c8);
        cmCommand::SetError(local_1e8,(string *)&e);
      }
      std::__cxx11::string::~string((string *)&e);
      return false;
    }
    bVar2 = std::operator==(pbVar1 + uVar5,"FILES");
    if (bVar2) {
      iVar6 = 2;
    }
    else {
      if (iVar6 == 3) {
        local_1d8 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start[uVar5]._M_dataplus._M_p;
      }
      else {
        if (iVar6 == 2) {
          local_1e0 = (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start[uVar5]._M_dataplus._M_p;
          iVar6 = 3;
          goto LAB_0024591b;
        }
        if (iVar6 != 1) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
          poVar3 = std::operator<<((ostream *)&e,"DIFFERENT given unknown argument ");
          std::operator<<(poVar3,(string *)
                                 ((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar5));
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(local_1e8,&local_1c8);
          std::__cxx11::string::~string((string *)&local_1c8);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
          return false;
        }
        local_1d0 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start[uVar5]._M_dataplus._M_p;
      }
      iVar6 = 0;
    }
LAB_0024591b:
    uVar5 = (ulong)((int)uVar5 + 1);
  } while( true );
}

Assistant:

bool cmFileCommand::HandleDifferentCommand(
  std::vector<std::string> const& args)
{
  /*
    FILE(DIFFERENT <variable> FILES <lhs> <rhs>)
   */

  // Evaluate arguments.
  const char* file_lhs = nullptr;
  const char* file_rhs = nullptr;
  const char* var = nullptr;
  enum Doing
  {
    DoingNone,
    DoingVar,
    DoingFileLHS,
    DoingFileRHS
  };
  Doing doing = DoingVar;
  for (unsigned int i = 1; i < args.size(); ++i) {
    if (args[i] == "FILES") {
      doing = DoingFileLHS;
    } else if (doing == DoingVar) {
      var = args[i].c_str();
      doing = DoingNone;
    } else if (doing == DoingFileLHS) {
      file_lhs = args[i].c_str();
      doing = DoingFileRHS;
    } else if (doing == DoingFileRHS) {
      file_rhs = args[i].c_str();
      doing = DoingNone;
    } else {
      std::ostringstream e;
      e << "DIFFERENT given unknown argument " << args[i];
      this->SetError(e.str());
      return false;
    }
  }
  if (!var) {
    this->SetError("DIFFERENT not given result variable name.");
    return false;
  }
  if (!file_lhs || !file_rhs) {
    this->SetError("DIFFERENT not given FILES option with two file names.");
    return false;
  }

  // Compare the files.
  const char* result =
    cmSystemTools::FilesDiffer(file_lhs, file_rhs) ? "1" : "0";
  this->Makefile->AddDefinition(var, result);
  return true;
}